

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O3

void __thiscall
gl4cts::CopyImage::IncompatibleFormatsCompressionTest::IncompatibleFormatsCompressionTest
          (IncompatibleFormatsCompressionTest *this,Context *context)

{
  pointer *pptVar1;
  GLenum GVar2;
  iterator iVar3;
  long lVar4;
  uint uVar5;
  testCase local_50;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"incompatible_formats_compression",
             "Test verifies if INVALID_OPERATION is generated when textures provided to CopySubImageData are incompatible, one of formats is compressed"
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IncompatibleFormatsCompressionTest_020c3970;
  lVar4 = 0;
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = 0xfffffffb;
  do {
    GVar2 = *(GLenum *)((long)&s_valid_targets + lVar4);
    if (((10 < uVar5 + 5) || ((0x487U >> (uVar5 + 5 & 0x1f) & 1) == 0)) && (1 < uVar5)) {
      local_50.m_dst_internal_format = 0x8d70;
      local_50.m_dst_format = 0x8d99;
      local_50.m_dst_type = 0x1405;
      local_50.m_src_internal_format = 0x8dbd;
      local_50.m_src_format = 0x8227;
      local_50.m_src_type = 0x1401;
      local_50.m_expected_result = 0;
      iVar3._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_50.m_tex_target = GVar2;
        std::
        vector<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>>
        ::_M_realloc_insert<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase_const&>
                  ((vector<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>>
                    *)&this->m_test_cases,iVar3,&local_50);
        iVar3._M_current =
             (this->m_test_cases).
             super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        (iVar3._M_current)->m_src_internal_format = 0x8dbd;
        (iVar3._M_current)->m_src_format = 0x8227;
        (iVar3._M_current)->m_src_type = 0x1401;
        (iVar3._M_current)->m_expected_result = 0;
        (iVar3._M_current)->m_tex_target = GVar2;
        (iVar3._M_current)->m_dst_internal_format = 0x8d70;
        (iVar3._M_current)->m_dst_format = 0x8d99;
        (iVar3._M_current)->m_dst_type = 0x1405;
        iVar3._M_current =
             (this->m_test_cases).
             super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
        (this->m_test_cases).
        super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
      }
      local_50.m_dst_internal_format = 0x8d76;
      local_50.m_dst_format = 0x8d99;
      local_50.m_dst_type = 0x1403;
      local_50.m_src_internal_format = 0x8dbd;
      local_50.m_src_format = 0x8227;
      local_50.m_src_type = 0x1401;
      local_50.m_expected_result = 0x502;
      if (iVar3._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_50.m_tex_target = GVar2;
        std::
        vector<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>>
        ::_M_realloc_insert<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase_const&>
                  ((vector<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>>
                    *)&this->m_test_cases,iVar3,&local_50);
      }
      else {
        (iVar3._M_current)->m_src_internal_format = 0x8dbd;
        (iVar3._M_current)->m_src_format = 0x8227;
        (iVar3._M_current)->m_src_type = 0x1401;
        (iVar3._M_current)->m_expected_result = 0x502;
        (iVar3._M_current)->m_tex_target = GVar2;
        (iVar3._M_current)->m_dst_internal_format = 0x8d76;
        (iVar3._M_current)->m_dst_format = 0x8d99;
        (iVar3._M_current)->m_dst_type = 0x1403;
        pptVar1 = &(this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x2c);
  return;
}

Assistant:

IncompatibleFormatsCompressionTest::IncompatibleFormatsCompressionTest(deqp::Context& context)
	: TestCase(context, "incompatible_formats_compression", "Test verifies if INVALID_OPERATION is generated when "
															"textures provided to CopySubImageData are incompatible, "
															"one of formats is compressed")
	, m_dst_tex_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];

		/* Skip 1D targets, not supported */
		if ((GL_TEXTURE_1D == tex_target) || (GL_TEXTURE_1D_ARRAY == tex_target) || (GL_TEXTURE_3D == tex_target) ||
			(GL_TEXTURE_RECTANGLE == tex_target) || (GL_RENDERBUFFER == tex_target))
		{
			continue;
		}

		/* Skip multisampled and rectangle targets */
		if (true == Utils::isTargetMultisampled(tex_target))
		{
			continue;
		}

		/* Compressed 128bit vs RGBA32UI */
		{
			testCase test_case = {
				tex_target, GL_RGBA32UI,	  GL_RGBA_INTEGER, GL_UNSIGNED_INT, GL_COMPRESSED_RG_RGTC2,
				GL_RG,		GL_UNSIGNED_BYTE, GL_NO_ERROR
			};

			m_test_cases.push_back(test_case);
		}

		/* Compressed 128bit vs RGBA16UI */
		{
			testCase test_case = {
				tex_target, GL_RGBA16UI,	  GL_RGBA_INTEGER,	 GL_UNSIGNED_SHORT, GL_COMPRESSED_RG_RGTC2,
				GL_RG,		GL_UNSIGNED_BYTE, GL_INVALID_OPERATION
			};

			m_test_cases.push_back(test_case);
		}
	}
}